

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server_req_handlers.cxx
# Opt level: O3

void __thiscall cornerstone::raft_server::rm_srv_from_cluster(raft_server *this,int32 srv_id)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  int iVar4;
  undefined4 extraout_var;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  _Node *p_Var6;
  element_type *peVar7;
  size_t sVar8;
  long *plVar9;
  ptr<log_entry> entry;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_128;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_120;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_118;
  cluster_config local_108 [5];
  char *local_40;
  _func_int **pp_Var5;
  
  iVar4 = (*((this->log_store_).
             super___shared_ptr<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_log_store[2])();
  pp_Var5 = (_func_int **)CONCAT44(extraout_var,iVar4);
  peVar7 = (this->config_).
           super___shared_ptr<cornerstone::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar2 = *(undefined4 *)&peVar7->log_idx_;
  uVar3 = *(undefined4 *)((long)&peVar7->log_idx_ + 4);
  this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
  this_01->_M_use_count = 1;
  this_01->_M_weak_count = 1;
  this_01->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001769f8;
  this_01[1]._vptr__Sp_counted_base = pp_Var5;
  this_01[1]._M_use_count = uVar2;
  this_01[1]._M_weak_count = uVar3;
  this_00 = this_01 + 2;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this_01[2]._M_use_count = this_00;
  this_01[2]._vptr__Sp_counted_base = (_func_int **)this_00;
  this_01[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  peVar7 = (this->config_).
           super___shared_ptr<cornerstone::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  plVar9 = (long *)(peVar7->servers_).
                   super__List_base<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
                   ._M_impl._M_node.super__List_node_base._M_next;
  if ((list<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
       *)plVar9 != &peVar7->servers_) {
    do {
      if (*(int *)plVar9[2] != srv_id) {
        p_Var6 = std::__cxx11::
                 list<std::shared_ptr<cornerstone::srv_config>,std::allocator<std::shared_ptr<cornerstone::srv_config>>>
                 ::_M_create_node<std::shared_ptr<cornerstone::srv_config>const&>
                           ((list<std::shared_ptr<cornerstone::srv_config>,std::allocator<std::shared_ptr<cornerstone::srv_config>>>
                             *)this_00,(shared_ptr<cornerstone::srv_config> *)(plVar9 + 2));
        std::__detail::_List_node_base::_M_hook(&p_Var6->super__List_node_base);
        this_01[3]._vptr__Sp_counted_base =
             (_func_int **)((long)this_01[3]._vptr__Sp_counted_base + 1);
        peVar7 = (this->config_).
                 super___shared_ptr<cornerstone::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      }
      plVar9 = (long *)*plVar9;
    } while ((list<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
              *)plVar9 != &peVar7->servers_);
    pp_Var5 = this_01[1]._vptr__Sp_counted_base;
  }
  peVar1 = (this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_40 = "removed a server from configuration and save the configuration to log store at %llu";
  snprintf((char *)local_108,200,
           "removed a server from configuration and save the configuration to log store at %llu",
           pp_Var5);
  local_128 = &local_118;
  sVar8 = strlen((char *)local_108);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_128,local_108,(long)&local_108[0].log_idx_ + sVar8);
  (*peVar1->_vptr_logger[3])(peVar1,&local_128);
  if (local_128 != &local_118) {
    operator_delete(local_128,(long)local_118._vptr__Sp_counted_base + 1);
  }
  this->config_changing_ = true;
  cluster_config::serialize(local_108);
  pp_Var5 = (_func_int **)
            ((this->state_).super___shared_ptr<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->term_;
  local_120 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
  local_120->_M_use_count = 1;
  local_120->_M_weak_count = 1;
  local_120->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00176820;
  local_128 = local_120 + 1;
  local_120[1]._vptr__Sp_counted_base = pp_Var5;
  local_120[1]._M_use_count = 2;
  *(undefined4 *)&local_120[2]._vptr__Sp_counted_base = (undefined4)local_108[0].log_idx_;
  *(undefined4 *)((long)&local_120[2]._vptr__Sp_counted_base + 4) = local_108[0].log_idx_._4_4_;
  local_120[2]._M_use_count = (_Atomic_word)local_108[0].prev_log_idx_;
  local_120[2]._M_weak_count = local_108[0].prev_log_idx_._4_4_;
  local_108[0].prev_log_idx_ = 0;
  local_120[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  (*((this->log_store_).super___shared_ptr<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr)->_vptr_log_store[5])();
  request_append_entries(this);
  if (local_120 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_120);
  }
  if (local_108[0].prev_log_idx_ != 0) {
    (*(code *)CONCAT44(local_108[0].log_idx_._4_4_,(undefined4)local_108[0].log_idx_))();
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  return;
}

Assistant:

void raft_server::rm_srv_from_cluster(int32 srv_id)
{
    ptr<cluster_config> new_conf = cs_new<cluster_config>(log_store_->next_slot(), config_->get_log_idx());
    for (cluster_config::const_srv_itor it = config_->get_servers().begin(); it != config_->get_servers().end(); ++it)
    {
        if ((*it)->get_id() != srv_id)
        {
            new_conf->get_servers().push_back(*it);
        }
    }

    l_->info(lstrfmt("removed a server from configuration and save the configuration to log store at %llu")
                 .fmt(new_conf->get_log_idx()));
    config_changing_ = true;
    bufptr new_conf_buf(new_conf->serialize());
    ptr<log_entry> entry(cs_new<log_entry>(state_->get_term(), std::move(new_conf_buf), log_val_type::conf));
    log_store_->append(entry);
    request_append_entries();
}